

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QScore.h
# Opt level: O3

void __thiscall FASTQ::QScore::PrecomputeScores(QScore *this)

{
  int iVar1;
  int qy;
  long lVar2;
  int (*paiVar3) [42];
  int qx;
  long lVar4;
  double dVar5;
  double dVar6;
  double __x;
  double dVar7;
  
  paiVar3 = this->mPosteriorScoresForMatch;
  lVar4 = 0;
  do {
    dVar5 = pow(10.0,(double)(int)lVar4 / -10.0);
    lVar2 = 0;
    do {
      dVar6 = pow(10.0,(double)(int)lVar2 / -10.0);
      dVar7 = (dVar5 * 4.0 * dVar6) / 3.0;
      __x = ((dVar5 * dVar6) / 3.0) / (((1.0 - dVar5) - dVar6) + dVar7);
      dVar7 = (double)(-(ulong)(dVar5 < dVar6) & (ulong)((1.0 - dVar6 / 3.0) * dVar5) |
                      ~-(ulong)(dVar5 < dVar6) & (ulong)((dVar5 / -3.0 + 1.0) * dVar6)) /
              ((dVar6 + dVar5) - dVar7);
      this->mPosteriorErrorProbabilitiesForMatch[0][lVar2] = __x;
      this->mPosteriorErrorProbabilitiesForMismatch[0][lVar2] = dVar7;
      dVar6 = log10(__x);
      dVar6 = round(dVar6 * -10.0);
      iVar1 = (int)dVar6;
      if (0x28 < iVar1) {
        iVar1 = 0x29;
      }
      (*paiVar3)[lVar2] = iVar1;
      dVar6 = log10(dVar7);
      dVar6 = round(dVar6 * -10.0);
      iVar1 = (int)dVar6;
      if (0x28 < iVar1) {
        iVar1 = 0x29;
      }
      paiVar3[0x2a][lVar2] = iVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x2a);
    lVar4 = lVar4 + 1;
    this = (QScore *)(this->mPosteriorErrorProbabilitiesForMatch + 1);
    paiVar3 = paiVar3 + 1;
  } while (lVar4 != 0x2a);
  return;
}

Assistant:

void PrecomputeScores() {
    for( int qx = 0; qx <= Q_MAX_SCORE; qx++ ) {
      double px = ScoreToProbability( qx );

      for( int qy = 0; qy <= Q_MAX_SCORE; qy++ ) {
        double py = ScoreToProbability( qy );

        double pm = ( px * py / 3.0 ) /
                    ( 1.0 - px - py + 4.0 * px * py / 3.0 ); // (8) in paper

        double pmm;
        if( px < py ) {
          // px < py: merged base is X
          pmm = px * ( 1.0 - py / 3.0 ) /
                ( px + py - 4.0 * px * py / 3.0 ); // (9) in paper
        } else {
          // py < px: merged base is Y
          pmm = py * ( 1.0 - px / 3.0 ) /
                ( px + py - 4.0 * px * py / 3.0 ); // (9) in paper
        }

        mPosteriorErrorProbabilitiesForMatch[ qx ][ qy ]    = pm;
        mPosteriorErrorProbabilitiesForMismatch[ qx ][ qy ] = pmm;

        mPosteriorScoresForMatch[ qx ][ qy ]    = ProbabilityToScore( pm );
        mPosteriorScoresForMismatch[ qx ][ qy ] = ProbabilityToScore( pmm );
      }
    }
  }